

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

treeNode * statement(void)

{
  bool bVar1;
  treeNode *this;
  string *this_00;
  allocator local_b1;
  string flag;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&flag,(string *)&nextToken.text);
  bVar1 = std::operator==(&flag,"if");
  if (bVar1) {
    this = ifStmt();
  }
  else {
    bVar1 = std::operator==(&flag,"read");
    if (bVar1) {
      this = readStmt();
    }
    else {
      bVar1 = std::operator==(&flag,"print");
      if (bVar1) {
        this = printStmt();
      }
      else {
        std::__cxx11::string::string((string *)&local_30,"continue",&local_b1);
        bVar1 = match(&local_30,Empty);
        std::__cxx11::string::~string((string *)&local_30);
        if (bVar1) {
          this = (treeNode *)operator_new(0x58);
          std::__cxx11::string::string((string *)&local_50,"",&local_b1);
          treeNode::treeNode(this,continueStmt,&local_50);
          this_00 = &local_50;
        }
        else {
          std::__cxx11::string::string((string *)&local_70,"break",&local_b1);
          bVar1 = match(&local_70,Empty);
          std::__cxx11::string::~string((string *)&local_70);
          if (!bVar1) {
            bVar1 = std::operator==(&flag,"do");
            if (bVar1) {
              this = doStmt();
            }
            else {
              bVar1 = std::operator==(&flag,anon_var_dwarf_73c6 + 0x15);
              if (bVar1) {
                this = whileStmt();
              }
              else {
                bVar1 = std::operator==(&flag,"for");
                if (bVar1) {
                  this = forStmt();
                }
                else {
                  bVar1 = std::operator==(&flag,";");
                  if (!bVar1) {
                    bVar1 = std::operator==(&flag,"int");
                    if ((((bVar1) || (bVar1 = std::operator==(&flag,"float"), bVar1)) ||
                        (bVar1 = std::operator==(&flag,"char"), bVar1)) ||
                       (((bVar1 = std::operator==(&flag,"string"), bVar1 ||
                         (bVar1 = std::operator==(&flag,"bool"), bVar1)) ||
                        (bVar1 = std::operator==(&flag,"byte"), bVar1)))) {
                      this = declareStmt();
                      goto LAB_00109ea1;
                    }
                    if (nextToken.kind == ID) {
                      this = assignStmt();
                      goto LAB_00109ea1;
                    }
                  }
                  this = (treeNode *)0x0;
                }
              }
            }
            goto LAB_00109ea1;
          }
          this = (treeNode *)operator_new(0x58);
          std::__cxx11::string::string((string *)&local_90,"",&local_b1);
          treeNode::treeNode(this,breakStmt,&local_90);
          this_00 = &local_90;
        }
        std::__cxx11::string::~string((string *)this_00);
      }
    }
  }
LAB_00109ea1:
  std::__cxx11::string::~string((string *)&flag);
  return this;
}

Assistant:

treeNode* statement()
{
    auto flag = nextToken.text;
    treeNode* ret=nullptr;
    if(flag=="if")
        return ifStmt();
    else if(flag=="read")
        return readStmt();
    else if(flag=="print")
        return printStmt();
    else if(match("continue"))
        return new treeNode(StmtKind::continueStmt,"");
    else if(match("break"))
        return new treeNode(StmtKind::breakStmt,"");
    else if(flag=="do")
        ret = doStmt();
    else if(flag=="while")
        return whileStmt();
    else if(flag=="for")
        return forStmt();
    else if(flag==";")
        return nullptr;
    else if(flag=="int"||flag=="float"||flag=="char"||flag=="string"||flag=="bool"||flag=="byte")
        ret = declareStmt();
    else if(nextToken.kind==Token::ID)
        ret = assignStmt();
    else 
        return nullptr;

    
    //match(";",Error::lackSem);
    return ret;
}